

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.h
# Opt level: O0

ByteData * __thiscall
cfd::core::ByteData::Concat<cfd::core::ByteData256,cfd::core::ByteData,cfd::core::ByteData>
          (ByteData *this,ByteData256 *top,ByteData *args,ByteData *args_1)

{
  ByteData *in_RCX;
  ByteData256 *in_RDX;
  ByteData *in_RSI;
  ByteData *in_RDI;
  ByteData *in_R8;
  ByteData result;
  ByteData local_40;
  ByteData *local_28;
  ByteData *local_20;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  Concat<cfd::core::ByteData256>(&local_40,in_RSI,in_RDX);
  Concat<cfd::core::ByteData,cfd::core::ByteData>(in_RDI,&local_40,local_20,local_28);
  ~ByteData((ByteData *)0x54cca7);
  return in_RDI;
}

Assistant:

ByteData Concat(const ByteTop& top, const ByteDataClass&... args) const {
    ByteData result = Concat(top);
    return result.Concat(args...);
  }